

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

void __thiscall cmMakefile::~cmMakefile(cmMakefile *this)

{
  size_type sVar1;
  cmMakefile *this_local;
  
  cmDeleteAll<std::vector<cmInstallGenerator*,std::allocator<cmInstallGenerator*>>>
            (&this->InstallGenerators);
  cmDeleteAll<std::vector<cmTestGenerator*,std::allocator<cmTestGenerator*>>>(&this->TestGenerators)
  ;
  cmDeleteAll<std::vector<cmSourceFile*,std::allocator<cmSourceFile*>>>(&this->SourceFiles);
  cmDeleteAll<std::map<std::__cxx11::string,cmTest*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmTest*>>>>
            (&this->Tests);
  cmDeleteAll<std::vector<cmTarget*,std::allocator<cmTarget*>>>(&this->ImportedTargetsOwned);
  cmDeleteAll<std::vector<cmCommand*,std::allocator<cmCommand*>>>(&this->FinalPassCommands);
  cmDeleteAll<std::vector<cmFunctionBlocker*,std::allocator<cmFunctionBlocker*>>>
            (&this->FunctionBlockers);
  std::vector<cmFunctionBlocker_*,_std::allocator<cmFunctionBlocker_*>_>::clear
            (&this->FunctionBlockers);
  sVar1 = std::vector<cmMakefile::PolicyStackEntry,_std::allocator<cmMakefile::PolicyStackEntry>_>::
          size(&this->PolicyStack);
  if (sVar1 != 1) {
    cmSystemTools::Error
              ("Internal CMake Error, Policy Stack has not been popped properly",(char *)0x0,
               (char *)0x0,(char *)0x0);
  }
  std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::~vector(&this->QtUiFilesWithOptions)
  ;
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*>_>_>
  ::~unordered_map(&this->OutputToSource);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(&this->PolicyBarriers);
  std::vector<cmMakefile::PolicyStackEntry,_std::allocator<cmMakefile::PolicyStackEntry>_>::~vector
            (&this->PolicyStack);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget_*>_>_>
  ::~unordered_map(&this->ImportedTargets);
  std::vector<cmTarget_*,_std::allocator<cmTarget_*>_>::~vector(&this->ImportedTargetsOwned);
  std::vector<cmMakefile::CallStackEntry,_std::allocator<cmMakefile::CallStackEntry>_>::~vector
            (&this->CallStack);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->ListFileStack);
  cmPropertyMap::~cmPropertyMap(&this->Properties);
  std::vector<cmMakefile_*,_std::allocator<cmMakefile_*>_>::~vector(&this->UnConfiguredDirectories);
  cmsys::RegularExpression::~RegularExpression(&this->cmNamedCurly);
  cmsys::RegularExpression::~RegularExpression(&this->cmAtVarRegex);
  cmsys::RegularExpression::~RegularExpression(&this->cmDefine01Regex);
  cmsys::RegularExpression::~RegularExpression(&this->cmDefineRegex);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->MacrosList);
  std::stack<int,_std::deque<int,_std::allocator<int>_>_>::~stack(&this->LoopBlockCounter);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            (&this->FunctionBlockerBarriers);
  std::vector<cmFunctionBlocker_*,_std::allocator<cmFunctionBlocker_*>_>::~vector
            (&this->FunctionBlockers);
  std::vector<cmCommand_*,_std::allocator<cmCommand_*>_>::~vector(&this->FinalPassCommands);
  std::vector<cmSourceGroup,_std::allocator<cmSourceGroup>_>::~vector(&this->SourceGroups);
  std::__cxx11::string::~string((string *)&this->DefineFlagsOrig);
  std::vector<cmValueWithOrigin,_std::allocator<cmValueWithOrigin>_>::~vector
            (&this->CompileDefinitionsEntries);
  std::vector<cmValueWithOrigin,_std::allocator<cmValueWithOrigin>_>::~vector
            (&this->CompileOptionsEntries);
  std::vector<cmValueWithOrigin,_std::allocator<cmValueWithOrigin>_>::~vector
            (&this->IncludeDirectoriesEntries);
  std::__cxx11::string::~string((string *)&this->DefineFlags);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->HeaderFileExtensions);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->SourceFileExtensions);
  std::__cxx11::string::~string((string *)&this->ComplainFileRegularExpression);
  std::__cxx11::string::~string((string *)&this->IncludeFileRegularExpression);
  std::vector<cmTestGenerator_*,_std::allocator<cmTestGenerator_*>_>::~vector(&this->TestGenerators)
  ;
  std::vector<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>::~vector
            (&this->InstallGenerators);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::LinkLibraryType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::LinkLibraryType>_>_>
  ::~vector(&this->LinkLibraries);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->OutputFiles);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->ListFiles);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set(&this->SystemIncludeDirectories);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->LinkDirectories);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTest_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTest_*>_>_>
  ::~map(&this->Tests);
  std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::~vector(&this->SourceFiles);
  std::
  map<const_cmTarget_*,_cmGeneratorTarget_*,_cmStrictTargetComparison,_std::allocator<std::pair<const_cmTarget_*const,_cmGeneratorTarget_*>_>_>
  ::~map(&this->GeneratorTargets);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget_*>_>_>
  ::~unordered_map(&this->AliasTargets);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>_>_>
  ::~unordered_map(&this->Targets);
  std::__cxx11::string::~string((string *)&this->ProjectName);
  std::set<cmListFileContext,_std::less<cmListFileContext>,_std::allocator<cmListFileContext>_>::
  ~set(&this->CMP0054ReportedIds);
  cmsys::auto_ptr<cmMakefile::Internals>::~auto_ptr(&this->Internal);
  return;
}

Assistant:

cmMakefile::~cmMakefile()
{
  cmDeleteAll(this->InstallGenerators);
  cmDeleteAll(this->TestGenerators);
  cmDeleteAll(this->SourceFiles);
  cmDeleteAll(this->Tests);
  cmDeleteAll(this->ImportedTargetsOwned);
  cmDeleteAll(this->FinalPassCommands);
  cmDeleteAll(this->FunctionBlockers);
  this->FunctionBlockers.clear();
  if (this->PolicyStack.size() != 1)
  {
    cmSystemTools::Error("Internal CMake Error, Policy Stack has not been"
      " popped properly");
  }
}